

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resample_filters.cpp
# Opt level: O2

float crnlib::tent_filter(float t)

{
  float fVar1;
  
  fVar1 = -t;
  if (-t <= t) {
    fVar1 = t;
  }
  return (float)(-(uint)(fVar1 < 1.0) & (uint)(1.0 - fVar1));
}

Assistant:

static float tent_filter(float t) /* box (*) box, bilinear/triangle */
{
  if (t < 0.0f)
    t = -t;

  if (t < 1.0f)
    return 1.0f - t;
  else
    return 0.0f;
}